

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

bool __thiscall
imrt::ApertureILS::acceptanceCriterion(ApertureILS *this,double new_eval,double prev_eval)

{
  code *pcVar1;
  int iVar2;
  ostream *this_00;
  void *this_01;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double in_XMM1_Qa;
  double r;
  double p;
  bool local_1;
  
  if (*(int *)(in_RDI + 0x20) == 0) {
    if (in_XMM1_Qa <= in_XMM0_Qa) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    if (*(int *)(in_RDI + 0x20) != 1) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    dVar3 = exp(-(in_XMM0_Qa - in_XMM1_Qa) / *(double *)(in_RDI + 0x38));
    iVar2 = rand();
    if (dVar3 < (double)iVar2 / 2147483647.0) {
      local_1 = false;
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cout,"  Accept worst. temperature: ");
      this_01 = (void *)std::ostream::operator<<(this_00,*(double *)(in_RDI + 0x38));
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ApertureILS::acceptanceCriterion(double new_eval, double prev_eval) {
  if (acceptance==0){
    //Only best solutions
    if (new_eval < prev_eval) return(true);
     return(false);
  } else if (acceptance==1) {
    //SA criterion
    double p = exp((double)-(new_eval-prev_eval)/temperature);
    double r = ((double)rand() / (RAND_MAX));
    if (r <= p){
      cout << "  Accept worst. temperature: "<< temperature<<endl;
      return(true);
    }
    return(false);
  }
}